

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::InlineRep::remove_prefix(InlineRep *this,size_t n)

{
  size_t sVar1;
  
  sVar1 = cord_internal::InlineData::Rep::inline_size((Rep *)this);
  cord_internal::SmallMemmove<false>
            ((this->data_).rep_.field_0.data + 1,(this->data_).rep_.field_0.data + n + 1,sVar1 - n);
  reduce_size(this,n);
  return;
}

Assistant:

inline void Cord::InlineRep::remove_prefix(size_t n) {
  cord_internal::SmallMemmove(data_.as_chars(), data_.as_chars() + n,
                              inline_size() - n);
  reduce_size(n);
}